

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O1

int32 align_start_utt(char *uttid)

{
  snode_t *psVar1;
  slink_s *psVar2;
  int iVar3;
  long lVar4;
  snode_t **ppsVar5;
  
  curfrm = 0;
  shead.score = 0;
  shead.hist = (history_t *)0x0;
  hist_head = (history_t *)0x0;
  n_active = 0;
  if (shead.succlist != (slink_s *)0x0) {
    iVar3 = 0;
    psVar2 = shead.succlist;
    ppsVar5 = cur_active;
    do {
      iVar3 = iVar3 + 1;
      psVar1 = psVar2->node;
      if (-1 < psVar1->active_frm) {
        __assert_fail("l->node->active_frm < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/s3_align.c"
                      ,0x40d,"int32 align_start_utt(char *)");
      }
      psVar1->active_frm = 0;
      n_active = iVar3;
      *ppsVar5 = psVar1;
      psVar2 = psVar2->next;
      ppsVar5 = ppsVar5 + 1;
    } while (psVar2 != (slink_s *)0x0);
  }
  lVar4 = (long)n_active;
  n_active = n_active + 1;
  cur_active[lVar4] = (snode_t *)0x0;
  return 0;
}

Assistant:

int32
align_start_utt(char *uttid)
{
    slink_t *l;

    curfrm = 0;
    shead.score = 0;
    shead.hist = NULL;
    hist_head = NULL;

    n_active = 0;
    for (l = shead.succlist; l; l = l->next) {
        assert(l->node->active_frm < 0);
        l->node->active_frm = 0;
        cur_active[n_active++] = l->node;
    }
    cur_active[n_active++] = NULL;

    return 0;
}